

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

bool Image_Function::IsBinary
               (Image *image,uint32_t startX,uint32_t startY,uint32_t width,uint32_t height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  undefined1 auVar7 [32];
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  Image_Function_Helper::Histogram(&local_40,Histogram,image,startX,startY,width,height);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar6 = true;
  }
  else {
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
    auVar10 = vpbroadcastq_avx512f();
    auVar10 = vpsrlq_avx512f(auVar10,2);
    do {
      auVar11 = vpbroadcastq_avx512f();
      auVar12 = vmovdqa64_avx512f(auVar13);
      auVar13 = vporq_avx512f(auVar11,auVar9);
      uVar3 = vpcmpuq_avx512f(auVar13,auVar10,2);
      auVar7 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                   (local_40.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar5));
      auVar8._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar7._4_4_;
      auVar8._0_4_ = (uint)((byte)uVar3 & 1) * auVar7._0_4_;
      auVar8._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar7._8_4_;
      auVar8._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar7._12_4_;
      auVar8._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar7._16_4_;
      auVar8._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar7._20_4_;
      auVar8._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar7._24_4_;
      auVar8._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar7._28_4_;
      uVar5 = uVar5 + 8;
      uVar4 = vptestmd_avx512vl(auVar8,auVar8);
      auVar13 = vpmovm2q_avx512dq(uVar4);
      auVar13 = vpsubq_avx512f(auVar12,auVar13);
    } while ((((ulong)((long)local_40.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish +
                      (-4 - (long)local_40.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 2) + 8 &
             0xfffffffffffffff8) != uVar5);
    auVar9 = vmovdqa64_avx512f(auVar13);
    bVar6 = (bool)((byte)uVar3 & 1);
    auVar10._0_8_ = (ulong)bVar6 * auVar9._0_8_ | (ulong)!bVar6 * auVar12._0_8_;
    bVar6 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar10._8_8_ = (ulong)bVar6 * auVar9._8_8_ | (ulong)!bVar6 * auVar12._8_8_;
    bVar6 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar10._16_8_ = (ulong)bVar6 * auVar9._16_8_ | (ulong)!bVar6 * auVar12._16_8_;
    bVar6 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar10._24_8_ = (ulong)bVar6 * auVar9._24_8_ | (ulong)!bVar6 * auVar12._24_8_;
    bVar6 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar10._32_8_ = (ulong)bVar6 * auVar9._32_8_ | (ulong)!bVar6 * auVar12._32_8_;
    bVar6 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar10._40_8_ = (ulong)bVar6 * auVar9._40_8_ | (ulong)!bVar6 * auVar12._40_8_;
    bVar6 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar10._48_8_ = (ulong)bVar6 * auVar9._48_8_ | (ulong)!bVar6 * auVar12._48_8_;
    auVar10._56_8_ = (uVar3 >> 7) * auVar9._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar12._56_8_;
    auVar7 = vextracti64x4_avx512f(auVar10,1);
    auVar9 = vpaddq_avx512f(auVar10,ZEXT3264(auVar7));
    auVar1 = vpaddq_avx(auVar9._0_16_,auVar9._16_16_);
    auVar2 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar2);
    bVar6 = auVar1._0_8_ < 3;
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool IsBinary( const Image & image, uint32_t startX, uint32_t startY, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, startX, startY, width, height );
        VerifyGrayScaleImage( image );

        const std::vector< uint32_t > histogram = Histogram( image, startX, startY, width, height );

        size_t counter = 0u;

        for( std::vector< uint32_t >::const_iterator value = histogram.begin(); value != histogram.end(); ++value ) {
            if( (*value) > 0u )
                ++counter;
        }

        return (counter < 3u);
    }